

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge
          (CrossingProcessor *this,ShapeEdgeId a_id,CrossingIterator *it)

{
  ostream *poVar1;
  S2LogMessage local_80;
  S2LogMessageVoidify local_69;
  ShapeEdgeId local_68;
  ShapeEdgeId local_60;
  undefined1 local_58 [8];
  Edge a;
  CrossingIterator *it_local;
  CrossingProcessor *this_local;
  int iStack_10;
  ShapeEdgeId a_id_local;
  
  iStack_10 = a_id.edge_id;
  a.v1.c_[2] = (VType)it;
  (*this->a_shape_->_vptr_S2Shape[8])
            (local_58,this->a_shape_,(ulong)(uint)this->chain_id_,
             (ulong)(uint)(iStack_10 - this->chain_start_));
  if (this->a_dimension_ == 0) {
    local_60 = a_id;
    a_id_local.shape_id._3_1_ =
         ProcessEdge0(this,a_id,(Edge *)local_58,(CrossingIterator *)a.v1.c_[2]);
  }
  else if (this->a_dimension_ == 1) {
    local_68 = a_id;
    a_id_local.shape_id._3_1_ =
         ProcessEdge1(this,a_id,(Edge *)local_58,(CrossingIterator *)a.v1.c_[2]);
  }
  else {
    if (this->a_dimension_ != 2) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0x513,kFatal,(ostream *)&std::cerr);
      poVar1 = S2LogMessage::stream(&local_80);
      poVar1 = std::operator<<(poVar1,"Check failed: (2) == (a_dimension_) ");
      S2LogMessageVoidify::operator&(&local_69,poVar1);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
    }
    a_id_local.shape_id._3_1_ =
         ProcessEdge2(this,a_id,(Edge *)local_58,(CrossingIterator *)a.v1.c_[2]);
  }
  return a_id_local.shape_id._3_1_;
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge(
    ShapeEdgeId a_id, CrossingIterator* it) {
  // chain_edge() is faster than edge() when there are multiple chains.
  auto a = a_shape_->chain_edge(chain_id_, a_id.edge_id - chain_start_);
  if (a_dimension_ == 0) {
    return ProcessEdge0(a_id, a, it);
  } else if (a_dimension_ == 1) {
    return ProcessEdge1(a_id, a, it);
  } else {
    S2_DCHECK_EQ(2, a_dimension_);
    return ProcessEdge2(a_id, a, it);
  }
}